

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::emitCatchAll(BinaryInstWriter *this,Try *curr)

{
  if ((this->func != (Function *)0x0) && (this->sourceMap == false)) {
    WasmBinaryWriter::writeExtraDebugLocation
              (this->parent,(Expression *)curr,this->func,
               (curr->catchBodies).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements);
  }
  BufferWithRandomAccess::operator<<(this->o,'\x19');
  return;
}

Assistant:

void BinaryInstWriter::emitCatchAll(Try* curr) {
  if (func && !sourceMap) {
    parent.writeExtraDebugLocation(curr, func, curr->catchBodies.size());
  }
  o << int8_t(BinaryConsts::CatchAll_Legacy);
}